

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O0

TRIPLERGB **
decimationEjection(BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,TRIPLERGB **mrx,int k,
                  char *filepath)

{
  BITMAPINFOHEADER bmInfo_00;
  BITMAPFILEHEADER bmFile_00;
  ulong uVar1;
  TRIPLERGB *pTVar2;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  TRIPLERGB **local_70;
  BITMAPFILEHEADER local_68;
  size_t j;
  ulong uStack_50;
  int idW;
  size_t i;
  TRIPLERGB **ppTStack_40;
  int idH;
  TRIPLERGB **decMrx;
  uint originW;
  uint originH;
  char *filepath_local;
  TRIPLERGB **ppTStack_20;
  int k_local;
  TRIPLERGB **mrx_local;
  BITMAPFILEHEADER bmFile_local;
  
  bmFile_local._0_8_ = bmFile._8_8_;
  mrx_local = bmFile._0_8_;
  decMrx._4_4_ = bmInfo.biHeight;
  decMrx._0_4_ = bmInfo.biWidth;
  bmInfo.biWidth = bmInfo.biWidth / (uint)k;
  bmInfo.biHeight = bmInfo.biHeight / (uint)k;
  bmInfo.biSizeImage = bmInfo.biWidth * bmInfo.biHeight * 3;
  uVar1 = SUB168(ZEXT416(bmInfo.biHeight) * ZEXT816(8),0);
  if (SUB168(ZEXT416(bmInfo.biHeight) * ZEXT816(8),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  _originW = filepath;
  filepath_local._4_4_ = k;
  ppTStack_20 = mrx;
  ppTStack_40 = (TRIPLERGB **)operator_new__(uVar1);
  i._4_4_ = 0;
  for (uStack_50 = 0; uStack_50 < decMrx._4_4_; uStack_50 = uStack_50 + 1) {
    if (uStack_50 % (ulong)(long)filepath_local._4_4_ == (long)(filepath_local._4_4_ + -1)) {
      uVar1 = SUB168(ZEXT416(bmInfo.biWidth) * ZEXT816(3),0);
      if (SUB168(ZEXT416(bmInfo.biWidth) * ZEXT816(3),8) != 0) {
        uVar1 = 0xffffffffffffffff;
      }
      pTVar2 = (TRIPLERGB *)operator_new__(uVar1);
      ppTStack_40[i._4_4_] = pTVar2;
      j._4_4_ = 0;
      local_68.bfReserved1 = 0;
      local_68.bfReserved2 = 0;
      local_68.bfOffBits = 0;
      for (; (ulong)local_68._8_8_ < (ulong)(uint)decMrx; local_68._8_8_ = local_68._8_8_ + 1) {
        if ((ulong)local_68._8_8_ % (ulong)(long)filepath_local._4_4_ ==
            (long)(filepath_local._4_4_ + -1)) {
          ppTStack_40[i._4_4_][j._4_4_].red = ppTStack_20[uStack_50][local_68._8_8_].red;
          ppTStack_40[i._4_4_][j._4_4_].green = ppTStack_20[uStack_50][local_68._8_8_].green;
          ppTStack_40[i._4_4_][j._4_4_].blue = ppTStack_20[uStack_50][local_68._8_8_].blue;
          j._4_4_ = j._4_4_ + 1;
        }
      }
      i._4_4_ = i._4_4_ + 1;
    }
  }
  local_70 = mrx_local;
  local_68.bfType = bmFile_local.bfType;
  local_68._2_2_ = bmFile_local._2_2_;
  local_68.bfSize = bmFile_local.bfSize;
  memcpy(&local_98,&bmInfo,0x28);
  bmFile_00.bfReserved1 = local_68.bfType;
  bmFile_00.bfReserved2 = local_68._2_2_;
  bmFile_00.bfOffBits = local_68.bfSize;
  bmFile_00._0_8_ = local_70;
  bmInfo_00.biHeight = (undefined4)uStack_90;
  bmInfo_00.biPlanes = uStack_90._4_2_;
  bmInfo_00.biBitCount = uStack_90._6_2_;
  bmInfo_00.biSize = (undefined4)local_98;
  bmInfo_00.biWidth = local_98._4_4_;
  bmInfo_00.biCompression = (undefined4)local_88;
  bmInfo_00.biSizeImage = local_88._4_4_;
  bmInfo_00.biXPelsPerMeter = (undefined4)uStack_80;
  bmInfo_00.biYPelsPerMeter = uStack_80._4_4_;
  bmInfo_00.biClrUsed = (undefined4)local_78;
  bmInfo_00.biClrImportant = local_78._4_4_;
  saveBMPFile(bmFile_00,bmInfo_00,ppTStack_40,_originW);
  return ppTStack_40;
}

Assistant:

TRIPLERGB **decimationEjection(BITMAPFILEHEADER bmFile,
                               BITMAPINFOHEADER bmInfo,
                               TRIPLERGB **mrx, int k, const char *filepath) {
    unsigned int originH = bmInfo.biHeight;
    unsigned int originW = bmInfo.biWidth;
    bmInfo.biWidth = originW / k;
    bmInfo.biHeight = originH / k;
    bmInfo.biSizeImage = bmInfo.biWidth * bmInfo.biHeight * 3;
    //cout << "Decimation... New size = " << m_bmInfo.biSizeImage << "\n";
    TRIPLERGB **decMrx = new TRIPLERGB *[bmInfo.biHeight];
    int idH = 0;
    for (size_t i = 0; i < originH; i++) {
        if ((i % k) == (k - 1)) {
            decMrx[idH] = new TRIPLERGB[bmInfo.biWidth];
            int idW = 0;
            for (size_t j = 0; j < originW; j++) {
                if ((j % k) == (k - 1)) {
                    decMrx[idH][idW].red = mrx[i][j].red;
                    decMrx[idH][idW].green = mrx[i][j].green;
                    decMrx[idH][idW].blue = mrx[i][j].blue;
                    idW++;
                }
            }
            idH++;
        }
    }
    saveBMPFile(bmFile, bmInfo, decMrx, filepath);
    return decMrx;
}